

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.h
# Opt level: O2

void __thiscall
lunasvg::SVGElement::
transverse<lunasvg::Document::querySelectorAll(std::__cxx11::string_const&)const::__0>
          (SVGElement *this,anon_class_16_2_c48942ba callback)

{
  Selector *pSVar1;
  bool bVar2;
  SVGElement *this_00;
  Selector *selector;
  _List_node_base *p_Var3;
  SelectorList *__range2;
  Element local_30;
  
  selector = ((callback.selectors)->
             super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = ((callback.selectors)->
           super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (selector == pSVar1) goto LAB_00118930;
    bVar2 = matchSelector(selector,this);
    selector = selector + 1;
  } while (!bVar2);
  Element::Element(&local_30,this);
  std::vector<lunasvg::Element,_std::allocator<lunasvg::Element>_>::emplace_back<lunasvg::Element>
            (callback.elements,&local_30);
LAB_00118930:
  p_Var3 = (_List_node_base *)&this->m_children;
  while (p_Var3 = (((_List_base<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
                     *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)&this->m_children) {
    this_00 = toSVGElement((unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_> *)
                           (p_Var3 + 1));
    if (this_00 != (SVGElement *)0x0) {
      transverse<lunasvg::Document::querySelectorAll(std::__cxx11::string_const&)const::__0>
                (this_00,callback);
    }
  }
  return;
}

Assistant:

inline void SVGElement::transverse(T callback)
{
    callback(this);
    for(const auto& child : m_children) {
        if(auto element = toSVGElement(child)) {
            element->transverse(callback);
        }
    }
}